

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

void __thiscall CTextRender::LoadFonts(CTextRender *this,IStorage *pStorage,IConsole *pConsole)

{
  json_object_entry *pjVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  char *pcVar6;
  json_value *value;
  undefined4 extraout_var_00;
  void *buffer;
  _json_value *p_Var7;
  CFontLanguageVariant *pCVar8;
  ulong uVar9;
  char *dst;
  long lVar10;
  uint size;
  _json_value *p_Var11;
  long lVar12;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  char aBuf [256];
  char aFilename [512];
  char aFontName [512];
  char aError [256];
  _json_value *local_678;
  json_settings local_668;
  char local_638 [256];
  undefined1 local_538 [512];
  char local_338 [512];
  char local_138 [256];
  long local_38;
  IOHANDLE pIVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*(pStorage->super_IInterface)._vptr_IInterface[4])
                    (pStorage,"fonts/index.json",1,0xffffffff,0,0,0,0);
  pIVar4 = (IOHANDLE)CONCAT44(extraout_var,iVar3);
  if (pIVar4 == (IOHANDLE)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (*(pConsole->super_IInterface)._vptr_IInterface[0x19])
                (pConsole,1,"textrender","couldn\'t open fonts index file",0);
      return;
    }
  }
  else {
    lVar5 = io_length(pIVar4);
    size = (uint)lVar5;
    pcVar6 = (char *)mem_alloc(size);
    io_read(pIVar4,pcVar6,size);
    io_close(pIVar4);
    mem_zero(&local_668,0x30);
    value = json_parse_ex(&local_668,pcVar6,(long)(int)size,local_138);
    mem_free(pcVar6);
    if (value == (json_value *)0x0) {
      (*(pConsole->super_IInterface)._vptr_IInterface[0x19])
                (pConsole,1,"fonts/index.json",local_138,0);
    }
    else {
      p_Var11 = &json_value_none;
      if ((value->type == json_object) && (uVar9 = (ulong)(value->u).string.length, uVar9 != 0)) {
        pjVar1 = (value->u).object.values;
        lVar5 = 0;
        do {
          iVar3 = strcmp(*(char **)((long)&pjVar1->name + lVar5),"font files");
          if (iVar3 == 0) {
            p_Var11 = *(_json_value **)((long)&pjVar1->value + lVar5);
            break;
          }
          lVar5 = lVar5 + 0x18;
        } while (uVar9 * 0x18 != lVar5);
      }
      if ((p_Var11->type == json_array) && ((p_Var11->u).boolean != 0)) {
        uVar9 = 0;
        do {
          p_Var7 = &json_value_none;
          if ((p_Var11->type == json_array) && (uVar9 < (p_Var11->u).string.length)) {
            p_Var7 = *(_json_value **)((p_Var11->u).string.ptr + uVar9 * 8);
          }
          pcVar6 = "";
          if (p_Var7->type == json_string) {
            pcVar6 = (p_Var7->u).string.ptr;
          }
          str_format(local_338,0x200,"fonts/%s",pcVar6);
          iVar3 = (*(pStorage->super_IInterface)._vptr_IInterface[4])
                            (pStorage,local_338,1,0xffffffff,local_538,0x200,0,0);
          pIVar4 = (IOHANDLE)CONCAT44(extraout_var_00,iVar3);
          if (pIVar4 != (IOHANDLE)0x0) {
            lVar5 = io_length(pIVar4);
            buffer = mem_alloc((uint)lVar5);
            this->m_apFontData[uVar9] = buffer;
            io_read(pIVar4,buffer,(uint)lVar5);
            io_close(pIVar4);
            iVar3 = LoadFontCollection(this,local_538,this->m_apFontData[uVar9],lVar5);
            if (iVar3 != 0) {
              str_format(local_638,0x100,"failed to load font. filename=\'%s\'",local_338);
              (*(pConsole->super_IInterface)._vptr_IInterface[0x19])
                        (pConsole,0,"textrender",local_638,0);
            }
          }
        } while ((uVar9 < 0xf) && (uVar9 = uVar9 + 1, uVar9 < (p_Var11->u).string.length));
      }
      p_Var11 = &json_value_none;
      if ((value->type == json_object) && (uVar9 = (ulong)(value->u).string.length, uVar9 != 0)) {
        pjVar1 = (value->u).object.values;
        lVar5 = 0;
        do {
          iVar3 = strcmp(*(char **)((long)&pjVar1->name + lVar5),"default");
          if (iVar3 == 0) {
            p_Var11 = *(_json_value **)((long)&pjVar1->value + lVar5);
            break;
          }
          lVar5 = lVar5 + 0x18;
        } while (uVar9 * 0x18 != lVar5);
      }
      if (p_Var11->type == json_string) {
        CGlyphMap::SetFaceByName
                  (this->m_pGlyphMap,&this->m_pGlyphMap->m_DefaultFace,(p_Var11->u).string.ptr);
      }
      p_Var11 = &json_value_none;
      if ((value->type == json_object) && (uVar9 = (ulong)(value->u).string.length, uVar9 != 0)) {
        pjVar1 = (value->u).object.values;
        lVar5 = 0;
        do {
          iVar3 = strcmp(*(char **)((long)&pjVar1->name + lVar5),"fallbacks");
          if (iVar3 == 0) {
            p_Var11 = *(_json_value **)((long)&pjVar1->value + lVar5);
            break;
          }
          lVar5 = lVar5 + 0x18;
        } while (uVar9 * 0x18 != lVar5);
      }
      if ((p_Var11->type == json_array) && ((p_Var11->u).boolean != 0)) {
        uVar9 = 0;
        do {
          p_Var7 = &json_value_none;
          if ((-1 < (int)uVar9) && (p_Var7 = &json_value_none, p_Var11->type == json_array)) {
            p_Var7 = *(_json_value **)((p_Var11->u).string.ptr + uVar9 * 8);
          }
          pcVar6 = "";
          if (p_Var7->type == json_string) {
            pcVar6 = (p_Var7->u).string.ptr;
          }
          CGlyphMap::AddFallbackFaceByName(this->m_pGlyphMap,pcVar6);
          uVar9 = uVar9 + 1;
        } while (uVar9 < (p_Var11->u).string.length);
      }
      local_678 = &json_value_none;
      if ((value->type == json_object) && (uVar9 = (ulong)(value->u).string.length, uVar9 != 0)) {
        pjVar1 = (value->u).object.values;
        lVar5 = 0;
        do {
          iVar3 = strcmp(*(char **)((long)&pjVar1->name + lVar5),"language variants");
          if (iVar3 == 0) {
            local_678 = *(_json_value **)((long)&pjVar1->value + lVar5);
            break;
          }
          lVar5 = lVar5 + 0x18;
        } while (uVar9 * 0x18 != lVar5);
      }
      if (local_678->type == json_object) {
        iVar3 = (local_678->u).boolean;
        this->m_NumVariants = iVar3;
        pcVar6 = (local_678->u).string.ptr;
        pCVar8 = (CFontLanguageVariant *)mem_alloc(iVar3 * 0x280);
        this->m_paVariants = pCVar8;
        if (0 < this->m_NumVariants) {
          lVar5 = 0x200;
          lVar12 = 0;
          lVar10 = 0;
          do {
            str_format(local_338,0x80,"languages/%s.json",*(undefined8 *)(pcVar6 + lVar12));
            str_copy((char *)((long)this->m_paVariants + lVar5 + -0x200),local_338,0x200);
            lVar2 = *(long *)((long)&((local_678->u).object.values)->value + lVar12);
            dst = this->m_paVariants->m_aLanguageFile + lVar5;
            if (*(int *)(lVar2 + 8) == 5) {
              str_copy(dst,*(char **)(lVar2 + 0x18),0x80);
            }
            else {
              *dst = '\0';
            }
            lVar10 = lVar10 + 1;
            lVar5 = lVar5 + 0x280;
            lVar12 = lVar12 + 0x18;
          } while (lVar10 < this->m_NumVariants);
        }
      }
      json_value_free(value);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::LoadFonts(IStorage *pStorage, IConsole *pConsole)
{
	// read file data into buffer
	const char *pFilename = "fonts/index.json";

	IOHANDLE File = pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "textrender", "couldn't open fonts index file");
		return;
	}
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return;
	}

	// extract font file definitions
	const json_value &rFiles = (*pJsonData)["font files"];
	if(rFiles.type == json_array)
	{
		for(unsigned i = 0; i < rFiles.u.array.length && i < MAX_FACES; ++i)
		{
			char aFontName[IO_MAX_PATH_LENGTH];
			str_format(aFontName, sizeof(aFontName), "fonts/%s", (const char *)rFiles[i]);
			char aFilename[IO_MAX_PATH_LENGTH];
			IOHANDLE File = pStorage->OpenFile(aFontName, IOFLAG_READ, IStorage::TYPE_ALL, aFilename, sizeof(aFilename));
			if(File)
			{
				long FileSize = io_length(File);
				m_apFontData[i] = mem_alloc(FileSize);
				io_read(File, m_apFontData[i], FileSize);
				io_close(File);
				if(LoadFontCollection(aFilename, m_apFontData[i], FileSize))
				{
					char aBuf[256];	
					str_format(aBuf, sizeof(aBuf), "failed to load font. filename='%s'", aFontName);	
					pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "textrender", aBuf);
				}
			}
		}
	}

	// extract default family name
	const json_value &rDefaultFace = (*pJsonData)["default"];
	if(rDefaultFace.type == json_string)
	{
		m_pGlyphMap->SetDefaultFaceByName((const char *)rDefaultFace);
	}

	// extract fallback family names
	const json_value &rFallbackFaces = (*pJsonData)["fallbacks"];
	if(rFallbackFaces.type == json_array)
	{
		for(unsigned i = 0; i < rFallbackFaces.u.array.length; ++i)
		{
			m_pGlyphMap->AddFallbackFaceByName((const char *)rFallbackFaces[i]);
		}
	}

	// extract language variant family names
	const json_value &rVariant = (*pJsonData)["language variants"];
	if(rVariant.type == json_object)
	{
		m_NumVariants = rVariant.u.object.length;
		json_object_entry *Entries = rVariant.u.object.values;
		m_paVariants = (CFontLanguageVariant *)mem_alloc(sizeof(CFontLanguageVariant)*m_NumVariants);
		for(int i = 0; i < m_NumVariants; ++i)
		{
			char aFileName[128];
			str_format(aFileName, sizeof(aFileName), "languages/%s.json", (const char *)Entries[i].name);
			str_copy(m_paVariants[i].m_aLanguageFile, aFileName, sizeof(m_paVariants[i].m_aLanguageFile));

			json_value *pFamilyName = rVariant.u.object.values[i].value;
			if(pFamilyName->type == json_string)
				str_copy(m_paVariants[i].m_aFamilyName, pFamilyName->u.string.ptr, sizeof(m_paVariants[i].m_aFamilyName));
			else
				m_paVariants[i].m_aFamilyName[0] = 0;
		}
	}

	json_value_free(pJsonData);
}